

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char * GetString(ConfigScanner *sc)

{
  char firstbyte;
  char *__src;
  size_t sVar1;
  size_t __n;
  long in_RDI;
  char *temp;
  size_t length;
  size_t step;
  char ch;
  char *start;
  char *local_8;
  
  if (in_RDI == 0) {
    local_8 = (char *)0x0;
  }
  else {
    __src = *(char **)(in_RDI + 0x18);
    while ((((((firstbyte = **(char **)(in_RDI + 0x18), firstbyte != ' ' && (firstbyte != '\t')) &&
              (firstbyte != '\r')) && ((firstbyte != '\n' && (firstbyte != '\0')))) &&
            ((firstbyte != ']' && firstbyte != '=' && ((firstbyte != '\"' && (firstbyte != '#'))))))
           && (firstbyte != ';'))) {
      sVar1 = GetUTF8Length(firstbyte);
      if (sVar1 == 0) {
        return (char *)0x0;
      }
      *(size_t *)(in_RDI + 0x18) = sVar1 + *(long *)(in_RDI + 0x18);
    }
    __n = *(long *)(in_RDI + 0x18) - (long)__src;
    if (__n == 0) {
      local_8 = (char *)0x0;
    }
    else {
      local_8 = (char *)malloc(__n + 1);
      memset(local_8,0,__n + 1);
      strncpy(local_8,__src,__n);
    }
  }
  return local_8;
}

Assistant:

char *GetString(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return NULL;
	}
	char *start = sc->ptr;
	while (true)
	{
		char ch = *sc->ptr;
		if ((ch == ' ') || (ch == '\t'))
		{
			break;
		}
		if ((ch == '\r') || (ch == '\n') || (ch == '\0'))
		{
			break;
		}
		if ((ch == ']') | (ch == '=') || (ch == '"'))
		{
			break;
		}
		if ((ch == '#') || (ch == ';'))
		{
			break;
		}
		size_t step = GetUTF8Length(ch);
		if (step == 0)
		{
			return NULL;
		}
		sc->ptr += step;
	}
	size_t length = sc->ptr - start;
	if (length == 0)
	{
		return NULL;
	}
	char *temp = (char *)malloc(length + 1);
	memset(temp, '\0', length + 1);
	strncpy(temp, start, length);
	return temp;
}